

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_adjacency.cpp
# Opt level: O0

spv_result_t spvtools::val::ValidateAdjacency(ValidationState_t *_)

{
  value_type *pvVar1;
  bool bVar2;
  Op OVar3;
  StorageClass SVar4;
  value_type *pvVar5;
  spv_ext_inst_type_t *psVar6;
  size_type sVar7;
  const_reference pvVar8;
  DiagnosticStream *pDVar9;
  DiagnosticStream local_970;
  DiagnosticStream local_798;
  DiagnosticStream local_5c0;
  DiagnosticStream local_3e8;
  DiagnosticStream local_210;
  Instruction *local_38;
  value_type *inst;
  size_t i;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *pvStack_20;
  int adjacency_status;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *instructions;
  ValidationState_t *__local;
  
  instructions = (vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *)
                 _;
  pvStack_20 = ValidationState_t::ordered_instructions(_);
  i._4_4_ = 3;
  inst = (value_type *)0x0;
  do {
    pvVar1 = inst;
    pvVar5 = (value_type *)
             std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
             size(pvStack_20);
    if (pvVar5 <= pvVar1) {
      return SPV_SUCCESS;
    }
    local_38 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ::operator[](pvStack_20,(size_type)inst);
    OVar3 = Instruction::opcode(local_38);
    pvVar1 = inst;
    if (OVar3 != OpLine) {
      if (OVar3 == OpExtInst) {
LAB_0026c51c:
        psVar6 = Instruction::ext_inst_type(local_38);
        bVar2 = spvExtInstIsDebugInfo(*psVar6);
        if ((!bVar2) ||
           (psVar6 = Instruction::ext_inst_type(local_38),
           *psVar6 == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100)) {
          i._4_4_ = 3;
        }
      }
      else if (OVar3 - OpFunction < 2) {
        i._4_4_ = 0;
      }
      else if (OVar3 == OpVariable) {
        SVar4 = Instruction::GetOperandAs<spv::StorageClass>(local_38,2);
        if ((SVar4 == Function) && (i._4_4_ != 1)) {
          ValidationState_t::diag
                    (&local_798,(ValidationState_t *)instructions,SPV_ERROR_INVALID_DATA,local_38);
          pDVar9 = DiagnosticStream::operator<<
                             (&local_798,
                              (char (*) [93])
                              "All OpVariable instructions in a function must be the first instructions in the first block."
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_798);
          return __local._4_4_;
        }
      }
      else if (OVar3 == OpPhi) {
        if (i._4_4_ != 2) {
          ValidationState_t::diag
                    (&local_210,(ValidationState_t *)instructions,SPV_ERROR_INVALID_DATA,local_38);
          pDVar9 = DiagnosticStream::operator<<
                             (&local_210,
                              (char (*) [55])
                              "OpPhi must appear within a non-entry block before all ");
          pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [24])"non-OpPhi instructions ");
          pDVar9 = DiagnosticStream::operator<<
                             (pDVar9,(char (*) [52])
                                     "(except for OpLine, which can be mixed with OpPhi).");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_210);
          return __local._4_4_;
        }
      }
      else if (OVar3 == OpLoopMerge) {
        i._4_4_ = 3;
        sVar7 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                ::size(pvStack_20);
        if (pvVar1 != (value_type *)(sVar7 - 1)) {
          pvVar8 = std::
                   vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                   operator[](pvStack_20,
                              (size_type)
                              ((long)&(inst->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
          OVar3 = Instruction::opcode(pvVar8);
          if (OVar3 != OpBranch && OVar3 != OpBranchConditional) {
            ValidationState_t::diag
                      (&local_3e8,(ValidationState_t *)instructions,SPV_ERROR_INVALID_DATA,local_38)
            ;
            pDVar9 = DiagnosticStream::operator<<
                               (&local_3e8,
                                (char (*) [48])"OpLoopMerge must immediately precede either an ");
            pDVar9 = DiagnosticStream::operator<<
                               (pDVar9,(char (*) [46])
                                       "OpBranch or OpBranchConditional instruction. ");
            pDVar9 = DiagnosticStream::operator<<
                               (pDVar9,(char (*) [55])
                                       "OpLoopMerge must be the second-to-last instruction in ");
            pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [11])0x3cee7b);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream(&local_3e8);
            return __local._4_4_;
          }
        }
      }
      else if (OVar3 == OpSelectionMerge) {
        i._4_4_ = 3;
        sVar7 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                ::size(pvStack_20);
        if (pvVar1 != (value_type *)(sVar7 - 1)) {
          pvVar8 = std::
                   vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                   operator[](pvStack_20,
                              (size_type)
                              ((long)&(inst->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
          OVar3 = Instruction::opcode(pvVar8);
          if (OVar3 != OpBranchConditional && OVar3 != OpSwitch) {
            ValidationState_t::diag
                      (&local_5c0,(ValidationState_t *)instructions,SPV_ERROR_INVALID_DATA,local_38)
            ;
            pDVar9 = DiagnosticStream::operator<<
                               (&local_5c0,
                                (char (*) [53])
                                "OpSelectionMerge must immediately precede either an ");
            pDVar9 = DiagnosticStream::operator<<
                               (pDVar9,(char (*) [46])
                                       "OpBranchConditional or OpSwitch instruction. ");
            pDVar9 = DiagnosticStream::operator<<
                               (pDVar9,(char (*) [45])"OpSelectionMerge must be the second-to-last "
                               );
            pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [26])"instruction in its block.")
            ;
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream(&local_5c0);
            return __local._4_4_;
          }
        }
      }
      else if (OVar3 == OpLabel) {
        bVar2 = i._4_4_ == 0;
        i._4_4_ = 2;
        if (bVar2) {
          i._4_4_ = 1;
        }
      }
      else if (OVar3 != OpNoLine) {
        if (OVar3 == OpUntypedVariableKHR) {
          SVar4 = Instruction::GetOperandAs<spv::StorageClass>(local_38,2);
          if ((SVar4 == Function) && (i._4_4_ != 1)) {
            ValidationState_t::diag
                      (&local_970,(ValidationState_t *)instructions,SPV_ERROR_INVALID_DATA,local_38)
            ;
            pDVar9 = DiagnosticStream::operator<<
                               (&local_970,
                                (char (*) [103])
                                "All OpUntypedVariableKHR instructions in a function must be the first instructions in the first block."
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream(&local_970);
            return __local._4_4_;
          }
        }
        else {
          if (OVar3 == OpExtInstWithForwardRefsKHR) goto LAB_0026c51c;
          i._4_4_ = 3;
        }
      }
    }
    inst = (value_type *)
           ((long)&(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

spv_result_t ValidateAdjacency(ValidationState_t& _) {
  const auto& instructions = _.ordered_instructions();
  int adjacency_status = PHI_AND_VAR_INVALID;

  for (size_t i = 0; i < instructions.size(); ++i) {
    const auto& inst = instructions[i];
    switch (inst.opcode()) {
      case spv::Op::OpFunction:
      case spv::Op::OpFunctionParameter:
        adjacency_status = IN_NEW_FUNCTION;
        break;
      case spv::Op::OpLabel:
        adjacency_status =
            adjacency_status == IN_NEW_FUNCTION ? IN_ENTRY_BLOCK : PHI_VALID;
        break;
      case spv::Op::OpExtInst:
      case spv::Op::OpExtInstWithForwardRefsKHR:
        // If it is a debug info instruction, we do not change the status to
        // allow debug info instructions before OpVariable in a function.
        // TODO(https://gitlab.khronos.org/spirv/SPIR-V/issues/533): We need
        // to discuss the location of DebugScope, DebugNoScope, DebugDeclare,
        // and DebugValue.
        // NOTE: This does not apply to the non-semantic vulkan debug info.
        if (!spvExtInstIsDebugInfo(inst.ext_inst_type()) ||
            inst.ext_inst_type() ==
                SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
          adjacency_status = PHI_AND_VAR_INVALID;
        }
        break;
      case spv::Op::OpPhi:
        if (adjacency_status != PHI_VALID) {
          return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                 << "OpPhi must appear within a non-entry block before all "
                 << "non-OpPhi instructions "
                 << "(except for OpLine, which can be mixed with OpPhi).";
        }
        break;
      case spv::Op::OpLine:
      case spv::Op::OpNoLine:
        break;
      case spv::Op::OpLoopMerge:
        adjacency_status = PHI_AND_VAR_INVALID;
        if (i != (instructions.size() - 1)) {
          switch (instructions[i + 1].opcode()) {
            case spv::Op::OpBranch:
            case spv::Op::OpBranchConditional:
              break;
            default:
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << "OpLoopMerge must immediately precede either an "
                     << "OpBranch or OpBranchConditional instruction. "
                     << "OpLoopMerge must be the second-to-last instruction in "
                     << "its block.";
          }
        }
        break;
      case spv::Op::OpSelectionMerge:
        adjacency_status = PHI_AND_VAR_INVALID;
        if (i != (instructions.size() - 1)) {
          switch (instructions[i + 1].opcode()) {
            case spv::Op::OpBranchConditional:
            case spv::Op::OpSwitch:
              break;
            default:
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << "OpSelectionMerge must immediately precede either an "
                     << "OpBranchConditional or OpSwitch instruction. "
                     << "OpSelectionMerge must be the second-to-last "
                     << "instruction in its block.";
          }
        }
        break;
      case spv::Op::OpVariable:
        if (inst.GetOperandAs<spv::StorageClass>(2) ==
                spv::StorageClass::Function &&
            adjacency_status != IN_ENTRY_BLOCK) {
          return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                 << "All OpVariable instructions in a function must be the "
                    "first instructions in the first block.";
        }
        break;
      case spv::Op::OpUntypedVariableKHR:
        if (inst.GetOperandAs<spv::StorageClass>(2) ==
                spv::StorageClass::Function &&
            adjacency_status != IN_ENTRY_BLOCK) {
          return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                 << "All OpUntypedVariableKHR instructions in a function must "
                    "be the first instructions in the first block.";
        }
        break;
      default:
        adjacency_status = PHI_AND_VAR_INVALID;
        break;
    }
  }

  return SPV_SUCCESS;
}